

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OneStepDelayControl * __thiscall
slang::BumpAllocator::emplace<slang::ast::OneStepDelayControl,slang::SourceRange>
          (BumpAllocator *this,SourceRange *args)

{
  OneStepDelayControl *this_00;
  SourceRange *args_local;
  BumpAllocator *this_local;
  
  this_00 = (OneStepDelayControl *)allocate(this,0x20,8);
  ast::OneStepDelayControl::OneStepDelayControl(this_00,*args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }